

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gia_ManDupMapped_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  uint Lit;
  int iVar3;
  Gia_Obj_t *pObj_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x2ea,"void Gia_ManDupMapped_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *)");
  }
  Gia_ManDupMapped_rec(p,pObj + -(ulong)uVar2,pNew);
  Gia_ManDupMapped_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pNew);
  uVar2 = Gia_ObjFanin0Copy(pObj);
  Lit = Abc_LitNotCond(pObj[-(*(ulong *)pObj >> 0x20 & 0x1fffffff)].Value,
                       (uint)(*(ulong *)pObj >> 0x3d) & 1);
  pObj_00 = Gia_ManAppendObj(pNew);
  iVar1 = Abc_Lit2Var(uVar2);
  if (pNew->nObjs <= iVar1) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  iVar1 = Abc_Lit2Var(Lit);
  if (iVar1 < pNew->nObjs) {
    if (pNew->fGiaSimple == 0) {
      iVar1 = Abc_Lit2Var(uVar2);
      iVar3 = Abc_Lit2Var(Lit);
      if (iVar1 == iVar3) {
        __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
    }
    iVar1 = Gia_ObjId(pNew,pObj_00);
    iVar3 = Abc_Lit2Var(uVar2);
    uVar4 = (ulong)(iVar1 - iVar3 & 0x1fffffff);
    if (uVar2 < Lit) {
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffe0000000 | uVar4;
      iVar1 = Abc_LitIsCompl(uVar2);
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
      iVar1 = Gia_ObjId(pNew,pObj_00);
      iVar3 = Abc_Lit2Var(Lit);
      *(ulong *)pObj_00 =
           *(ulong *)pObj_00 & 0xe0000000ffffffff | (ulong)(iVar1 - iVar3 & 0x1fffffff) << 0x20;
      uVar2 = Abc_LitIsCompl(Lit);
      uVar4 = (ulong)uVar2 << 0x3d;
      uVar5 = 0xdfffffffffffffff;
    }
    else {
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xe0000000ffffffff | uVar4 << 0x20;
      uVar2 = Abc_LitIsCompl(uVar2);
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xdfffffffffffffff | (ulong)uVar2 << 0x3d;
      iVar1 = Gia_ObjId(pNew,pObj_00);
      iVar3 = Abc_Lit2Var(Lit);
      *(ulong *)pObj_00 =
           *(ulong *)pObj_00 & 0xffffffffe0000000 | (ulong)(iVar1 - iVar3 & 0x1fffffff);
      iVar1 = Abc_LitIsCompl(Lit);
      uVar4 = (ulong)(uint)(iVar1 << 0x1d);
      uVar5 = 0xffffffffdfffffff;
    }
    uVar6 = *(ulong *)pObj_00;
    *(ulong *)pObj_00 = uVar5 & uVar6 | uVar4;
    if (pNew->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pNew,pObj_00 + -(uVar5 & uVar6 & 0x1fffffff),pObj_00);
      Gia_ObjAddFanout(pNew,pObj_00 + -((ulong)*(uint *)&pObj_00->field_0x4 & 0x1fffffff),pObj_00);
    }
    if (pNew->fSweeper != 0) {
      uVar5 = *(ulong *)pObj_00 & 0x1fffffff;
      uVar4 = *(ulong *)pObj_00 >> 0x20 & 0x1fffffff;
      uVar6 = 0x4000000000000000;
      uVar7 = 0x4000000000000000;
      if (((uint)*(ulong *)(pObj_00 + -uVar5) >> 0x1e & 1) == 0) {
        uVar7 = 0x40000000;
      }
      *(ulong *)(pObj_00 + -uVar5) = uVar7 | *(ulong *)(pObj_00 + -uVar5);
      uVar7 = *(ulong *)(pObj_00 + -uVar4);
      if (((uint)uVar7 >> 0x1e & 1) == 0) {
        uVar6 = 0x40000000;
      }
      *(ulong *)(pObj_00 + -uVar4) = uVar6 | uVar7;
      uVar4 = *(ulong *)pObj_00;
      *(ulong *)pObj_00 =
           uVar4 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar4 >> 0x3d) ^ (uint)(uVar7 >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pObj_00 + -uVar5) >> 0x3f) ^
                  (uint)(uVar4 >> 0x1d) & 7)) << 0x3f;
    }
    if (pNew->fBuiltInSim != 0) {
      uVar4 = *(ulong *)pObj_00;
      *(ulong *)pObj_00 =
           uVar4 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar4 >> 0x3d) ^
                   (uint)((ulong)*(undefined8 *)(pObj_00 + -(uVar4 >> 0x20 & 0x1fffffff)) >> 0x3f))
                  & ((uint)((ulong)*(undefined8 *)(pObj_00 + -(uVar4 & 0x1fffffff)) >> 0x3f) ^
                    (uint)(uVar4 >> 0x1d) & 7)) << 0x3f;
      iVar1 = Gia_ObjId(pNew,pObj_00);
      Gia_ManBuiltInSimPerform(pNew,iVar1);
    }
    if (pNew->vSuppWords != (Vec_Wrd_t *)0x0) {
      Gia_ManQuantSetSuppAnd(pNew,pObj_00);
    }
    iVar1 = Gia_ObjId(pNew,pObj_00);
    pObj->Value = iVar1 * 2;
    p_00 = pNew->vLutConfigs;
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(p_00,iVar1);
    return;
  }
  __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManDupMapped_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManDupMapped_rec( p, Gia_ObjFanin0(pObj), pNew );
    Gia_ManDupMapped_rec( p, Gia_ObjFanin1(pObj), pNew );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Vec_IntPush( pNew->vLutConfigs, Gia_ObjId(p, pObj) );
}